

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O1

void ZXing::Aztec::GenerateCheckWords
               (BitArray *bitArray,int totalBits,int wordSize,BitArray *messageBits)

{
  pointer puVar1;
  pointer puVar2;
  GenericGF *field;
  invalid_argument *this;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int in_R9D;
  uint *puVar6;
  bool bVar7;
  vector<int,_std::allocator<int>_> messageWords;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<int,_std::allocator<int>_> local_68;
  string local_50;
  
  uVar5 = (long)totalBits % (long)wordSize & 0xffffffff;
  ToInts<int,void>(&local_68,(ZXing *)bitArray,(BitArray *)(ulong)(uint)wordSize,
                   totalBits / wordSize,0,in_R9D);
  switch(wordSize) {
  case 4:
    field = GenericGF::AztecParam();
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_50,wordSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "Unsupported word size ",&local_50);
    std::invalid_argument::invalid_argument(this,(string *)local_88);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 6:
    field = GenericGF::AztecData6();
    break;
  case 8:
    field = GenericGF::AztecData8();
    break;
  case 10:
    field = GenericGF::AztecData10();
    break;
  case 0xc:
    field = GenericGF::AztecData12();
  }
  puVar1 = (bitArray->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (bitArray->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ReedSolomonEncoder::ReedSolomonEncoder((ReedSolomonEncoder *)local_88,field);
  ReedSolomonEncoder::encode
            ((ReedSolomonEncoder *)local_88,&local_68,
             (((int)puVar1 - (int)puVar2) + totalBits) / wordSize);
  std::__cxx11::_List_base<ZXing::GenericGFPoly,_std::allocator<ZXing::GenericGFPoly>_>::_M_clear
            ((_List_base<ZXing::GenericGFPoly,_std::allocator<ZXing::GenericGFPoly>_> *)
             (local_88 + 8));
  local_88._0_8_ = (GenericGF *)0x0;
  local_88._8_8_ = (_List_node_base *)0x0;
  local_78._M_allocated_capacity = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&messageBits->_bits,local_88);
  if ((GenericGF *)local_88._0_8_ != (GenericGF *)0x0) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity - local_88._0_8_);
  }
  if ((int)((long)totalBits % (long)wordSize) != 0) {
    do {
      local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&messageBits->_bits,local_88);
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar6 = (uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      uVar4 = *puVar6;
      uVar3 = wordSize - 1;
      do {
        local_88[0] = (uVar4 >> (uVar3 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&messageBits->_bits,local_88);
        bVar7 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar7);
      puVar6 = puVar6 + 1;
    } while (puVar6 != (uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  if ((uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void GenerateCheckWords(const BitArray& bitArray, int totalBits, int wordSize, BitArray& messageBits)
{
	// bitArray is guaranteed to be a multiple of the wordSize, so no padding needed
	std::vector<int> messageWords = ToInts(bitArray, wordSize, totalBits / wordSize);
	ReedSolomonEncode(GetGFFromWordSize(wordSize), messageWords, (totalBits - bitArray.size()) / wordSize);
	int startPad = totalBits % wordSize;
	messageBits = BitArray();
	messageBits.appendBits(0, startPad);
	for (int messageWord : messageWords)
		messageBits.appendBits(messageWord, wordSize);
}